

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeImplicitModuleImports(ExpressionContext *ctx)

{
  SmallArray<ModuleData_*,_128U> *this;
  ModuleData **ppMVar1;
  ModuleData *pMVar2;
  char *__src;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  TraceScope traceScope_1;
  TraceScope traceScope;
  TraceScope local_50;
  TraceScope local_40;
  
  if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
     (iVar6 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
     iVar6 != 0)) {
    AnalyzeImplicitModuleImports::token =
         NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImports");
    __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,AnalyzeImplicitModuleImports::token);
  uVar5 = (ctx->uniqueDependencies).count;
  if (uVar5 != 0) {
    this = &ctx->implicitImports;
    uVar10 = 0;
    do {
      uVar9 = (ulong)(ctx->imports).count;
      ppMVar1 = (ctx->uniqueDependencies).data;
      if (uVar9 != 0) {
        uVar8 = 0;
        do {
          if ((ctx->imports).data[uVar8]->bytecode == ppMVar1[uVar10]->bytecode) goto LAB_00202c9a;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      uVar7 = (ctx->implicitImports).count;
      if ((ulong)uVar7 != 0) {
        uVar9 = 0;
        do {
          if (this->data[uVar9]->bytecode == ppMVar1[uVar10]->bytecode) goto LAB_00202c9a;
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      if (uVar7 == (ctx->implicitImports).max) {
        SmallArray<ModuleData_*,_128U>::grow(this,uVar7);
      }
      if (this->data == (ModuleData **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ModuleData *, 128>::push_back(const T &) [T = ModuleData *, N = 128]"
                     );
      }
      pMVar2 = ppMVar1[uVar10];
      uVar5 = (ctx->implicitImports).count;
      (ctx->implicitImports).count = uVar5 + 1;
      this->data[uVar5] = pMVar2;
      uVar5 = (ctx->uniqueDependencies).count;
LAB_00202c9a:
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar5);
  }
  if ((ctx->implicitImports).count != 0) {
    uVar10 = 0;
    do {
      pMVar2 = (ctx->implicitImports).data[uVar10];
      if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
         (iVar6 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
         iVar6 != 0)) {
        AnalyzeImplicitModuleImports(ExpressionContext&)::token =
             NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImport");
        __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
      }
      NULLC::TraceScope::TraceScope
                (&local_50,AnalyzeImplicitModuleImports(ExpressionContext&)::token);
      lVar4 = NULLC::traceContext;
      __src = (pMVar2->name).begin;
      uVar9 = (long)(pMVar2->name).end - (long)__src;
      iVar6 = (int)uVar9;
      if (iVar6 != 0) {
        uVar7 = iVar6 + 1;
        uVar5 = *(uint *)(NULLC::traceContext + 0x264);
        if ((uVar5 <= *(int *)(NULLC::traceContext + 0x260) + uVar7) ||
           (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
          NULLC::TraceDump();
          uVar5 = *(uint *)(lVar4 + 0x264);
        }
        if (uVar5 <= uVar7) {
          __assert_fail("count + 1 < context.labels.max",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                        ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
        }
        uVar5 = *(uint *)(lVar4 + 0x260);
        memcpy((void *)((ulong)uVar5 + *(long *)(lVar4 + 0x268)),__src,uVar9 & 0xffffffff);
        *(undefined1 *)(*(long *)(lVar4 + 0x268) + (ulong)(uint)(*(int *)(lVar4 + 0x260) + iVar6)) =
             0;
        *(int *)(lVar4 + 0x260) = *(int *)(lVar4 + 0x260) + uVar7;
        lVar3 = *(long *)(lVar4 + 0x278);
        uVar7 = *(uint *)(lVar4 + 0x270);
        *(uint *)(lVar4 + 0x270) = uVar7 + 1;
        *(uint *)(lVar3 + (ulong)uVar7 * 8) = uVar5 * 4 + 2;
        *(undefined4 *)(lVar3 + 4 + (ulong)uVar7 * 8) = 0;
      }
      ImportModule(ctx,pMVar2->source,pMVar2->bytecode,pMVar2->lexStream,pMVar2->lexStreamSize,
                   pMVar2->name);
      NULLC::TraceScope::~TraceScope(&local_50);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ctx->implicitImports).count);
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void AnalyzeImplicitModuleImports(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImports");

	// Find which transitive dependencies haven't been imported explicitly
	for(unsigned i = 0; i < ctx.uniqueDependencies.size(); i++)
	{
		bool hasImport = false;

		for(unsigned k = 0; k < ctx.imports.size(); k++)
		{
			if(ctx.imports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImport = true;
				break;
			}
		}

		if(hasImport)
			continue;

		bool hasImplicitImport = false;

		for(unsigned k = 0; k < ctx.implicitImports.size(); k++)
		{
			if(ctx.implicitImports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImplicitImport = true;
				break;
			}
		}

		if(hasImplicitImport)
			continue;

		ctx.implicitImports.push_back(ctx.uniqueDependencies[i]);
	}

	// Import additional modules
	for(unsigned i = 0; i < ctx.implicitImports.size(); i++)
	{
		ModuleData *moduleData = ctx.implicitImports[i];

		TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImport");
		TRACE_LABEL2(moduleData->name.begin, moduleData->name.end);

		ImportModule(ctx, moduleData->source, moduleData->bytecode, moduleData->lexStream, moduleData->lexStreamSize, moduleData->name);
	}
}